

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O1

double calc_kurtosis_weighted<double,long,std::vector<double,std::allocator<double>>,double>
                 (size_t *ix_arr,size_t st,size_t end,size_t col_num,double *Xc,long *Xc_ind,
                 long *Xc_indptr,MissingAction missing_action,
                 vector<double,_std::allocator<double>_> *w)

{
  ulong *puVar1;
  long lVar2;
  pointer pdVar3;
  bool bVar4;
  size_t sVar5;
  ulong uVar6;
  ulong *puVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong *puVar12;
  ulong *puVar13;
  long lVar14;
  double __z;
  double dVar15;
  double __z_00;
  double __z_01;
  double dVar16;
  double dVar17;
  double dVar18;
  double local_a8;
  
  lVar14 = Xc_indptr[col_num];
  lVar2 = Xc_indptr[col_num + 1];
  if (lVar14 != lVar2) {
    dVar15 = 0.0;
    if (st <= end) {
      sVar5 = st;
      do {
        dVar15 = dVar15 + (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start[ix_arr[sVar5]];
        sVar5 = sVar5 + 1;
      } while (sVar5 <= end);
    }
    if (0.0 < dVar15) {
      puVar7 = ix_arr + st;
      puVar12 = ix_arr + end + 1;
      uVar6 = (long)puVar12 - (long)puVar7 >> 3;
      if (0 < (long)uVar6) {
        do {
          uVar8 = uVar6 >> 1;
          uVar11 = ~uVar8 + uVar6;
          uVar6 = uVar8;
          if (puVar7[uVar8] < (ulong)Xc_ind[lVar14]) {
            puVar7 = puVar7 + uVar8 + 1;
            uVar6 = uVar11;
          }
        } while (0 < (long)uVar6);
      }
      uVar6 = Xc_ind[lVar2 + -1];
      if (missing_action == Fail) {
        __z_01 = 0.0;
        if (lVar14 != lVar2 && puVar7 != puVar12) {
          pdVar3 = (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          __z = 0.0;
          __z_00 = 0.0;
          local_a8 = 0.0;
          while (uVar8 = *puVar7, uVar8 <= uVar6) {
            puVar1 = (ulong *)(Xc_ind + lVar14);
            uVar11 = *puVar1;
            if (uVar11 == uVar8) {
              dVar16 = pdVar3[uVar8];
              dVar17 = Xc[lVar14];
              dVar18 = dVar17 * dVar17;
              __z = fma(dVar16,dVar17,__z);
              __z_00 = fma(dVar16,dVar18,__z_00);
              local_a8 = fma(dVar16,dVar17 * dVar18,local_a8);
              __z_01 = fma(dVar16,dVar18 * dVar18,__z_01);
              if ((puVar7 == ix_arr + end) || (lVar14 == lVar2 + -1)) break;
              puVar13 = puVar1 + 1;
              puVar7 = puVar7 + 1;
              uVar8 = (long)Xc_ind + (lVar2 * 8 - (long)puVar13) >> 3;
              if (0 < (long)uVar8) {
                do {
                  uVar11 = uVar8 >> 1;
                  uVar9 = ~uVar11 + uVar8;
                  uVar8 = uVar11;
                  if (puVar13[uVar11] < *puVar7) {
                    puVar13 = puVar13 + uVar11 + 1;
                    uVar8 = uVar9;
                  }
                } while (0 < (long)uVar8);
              }
LAB_0012d1d2:
              lVar14 = (long)puVar13 - (long)Xc_ind >> 3;
            }
            else {
              if ((long)uVar11 <= (long)uVar8) {
                puVar13 = puVar1 + 1;
                uVar11 = (long)Xc_ind + (lVar2 * 8 - (long)(puVar1 + 1)) >> 3;
                while (0 < (long)uVar11) {
                  uVar9 = uVar11 >> 1;
                  uVar10 = ~uVar9 + uVar11;
                  uVar11 = uVar9;
                  if (puVar13[uVar9] < uVar8) {
                    puVar13 = puVar13 + uVar9 + 1;
                    uVar11 = uVar10;
                  }
                }
                goto LAB_0012d1d2;
              }
              puVar7 = puVar7 + 1;
              uVar8 = (long)puVar12 - (long)puVar7 >> 3;
              while (0 < (long)uVar8) {
                uVar9 = uVar8 >> 1;
                uVar10 = ~uVar9 + uVar8;
                uVar8 = uVar9;
                if (puVar7[uVar9] < uVar11) {
                  puVar7 = puVar7 + uVar9 + 1;
                  uVar8 = uVar10;
                }
              }
            }
            if ((puVar7 == puVar12) || (lVar14 == lVar2)) break;
          }
        }
        else {
          local_a8 = 0.0;
          __z_00 = 0.0;
          __z = 0.0;
        }
      }
      else {
        if (lVar14 != lVar2 && puVar7 != puVar12) {
          pdVar3 = (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          __z = 0.0;
          __z_00 = 0.0;
          local_a8 = 0.0;
          __z_01 = 0.0;
          while (uVar8 = *puVar7, uVar8 <= uVar6) {
            puVar1 = (ulong *)(Xc_ind + lVar14);
            uVar11 = *puVar1;
            if (uVar11 == uVar8) {
              dVar16 = pdVar3[uVar8];
              dVar17 = Xc[lVar14];
              if ((ulong)ABS(dVar17) < 0x7ff0000000000000) {
                dVar18 = dVar17 * dVar17;
                __z = fma(dVar16,dVar17,__z);
                __z_00 = fma(dVar16,dVar18,__z_00);
                local_a8 = fma(dVar16,dVar17 * dVar18,local_a8);
                __z_01 = fma(dVar16,dVar18 * dVar18,__z_01);
              }
              else {
                dVar15 = dVar15 - dVar16;
              }
              if ((puVar7 == ix_arr + end) || (lVar14 == lVar2 + -1)) break;
              puVar13 = puVar1 + 1;
              puVar7 = puVar7 + 1;
              uVar8 = (long)Xc_ind + (lVar2 * 8 - (long)puVar13) >> 3;
              if (0 < (long)uVar8) {
                do {
                  uVar11 = uVar8 >> 1;
                  uVar9 = ~uVar11 + uVar8;
                  uVar8 = uVar11;
                  if (puVar13[uVar11] < *puVar7) {
                    puVar13 = puVar13 + uVar11 + 1;
                    uVar8 = uVar9;
                  }
                } while (0 < (long)uVar8);
              }
LAB_0012cf98:
              lVar14 = (long)puVar13 - (long)Xc_ind >> 3;
            }
            else {
              if ((long)uVar11 <= (long)uVar8) {
                puVar13 = puVar1 + 1;
                uVar11 = (long)Xc_ind + (lVar2 * 8 - (long)(puVar1 + 1)) >> 3;
                while (0 < (long)uVar11) {
                  uVar9 = uVar11 >> 1;
                  uVar10 = ~uVar9 + uVar11;
                  uVar11 = uVar9;
                  if (puVar13[uVar9] < uVar8) {
                    puVar13 = puVar13 + uVar9 + 1;
                    uVar11 = uVar10;
                  }
                }
                goto LAB_0012cf98;
              }
              puVar7 = puVar7 + 1;
              uVar8 = (long)puVar12 - (long)puVar7 >> 3;
              while (0 < (long)uVar8) {
                uVar9 = uVar8 >> 1;
                uVar10 = ~uVar9 + uVar8;
                uVar8 = uVar9;
                if (puVar7[uVar9] < uVar11) {
                  puVar7 = puVar7 + uVar9 + 1;
                  uVar8 = uVar10;
                }
              }
            }
            if ((puVar7 == puVar12) || (lVar14 == lVar2)) break;
          }
        }
        else {
          __z_01 = 0.0;
          local_a8 = 0.0;
          __z_00 = 0.0;
          __z = 0.0;
        }
        if (dVar15 <= 0.0) {
          return -INFINITY;
        }
      }
      if ((1.0 < dVar15) && ((__z_00 != 0.0 || (NAN(__z_00))))) {
        if ((__z_00 != __z * __z) || (NAN(__z_00) || NAN(__z * __z))) {
          dVar18 = __z / dVar15;
          dVar16 = dVar18 * dVar18;
          dVar17 = __z_00 / dVar15 - dVar16;
          if ((!NAN(dVar17)) &&
             ((2.220446049250313e-16 < dVar17 ||
              (bVar4 = check_more_than_two_unique_values<double,long>
                                 (ix_arr,st,end,col_num,Xc_indptr,Xc_ind,Xc,missing_action), bVar4))
             )) {
            if (dVar17 <= 0.0) {
              return 0.0;
            }
            dVar15 = (dVar16 * dVar18 * dVar18 * dVar15 +
                     __z * -4.0 * dVar16 * dVar18 +
                     __z_00 * 6.0 * dVar16 + local_a8 * -4.0 * dVar18 + __z_01) /
                     (dVar17 * dVar17 * dVar15);
            if ((long)ABS(dVar15) < 0x7ff0000000000000) {
              if (dVar15 <= 0.0) {
                return 0.0;
              }
              return dVar15;
            }
            return -INFINITY;
          }
        }
      }
    }
  }
  return -INFINITY;
}

Assistant:

double calc_kurtosis_weighted(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                              real_t Xc[], sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                              MissingAction missing_action, mapping &restrict w)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
        return -HUGE_VAL;

    ldouble_safe s1 = 0;
    ldouble_safe s2 = 0;
    ldouble_safe s3 = 0;
    ldouble_safe s4 = 0;
    ldouble_safe x_sq;
    ldouble_safe w_this;
    ldouble_safe cnt = 0;
    for (size_t row = st; row <= end; row++)
        cnt += w[ix_arr[row]];

    if (unlikely(cnt <= 0)) return -HUGE_VAL;
    
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);

    ldouble_safe xval;

    if (missing_action != Fail)
    {
        for (size_t *row = ptr_st;
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                w_this = w[*row];
                xval = Xc[curr_pos];

                if (unlikely(is_na_or_inf(xval)))
                {
                    cnt -= w_this;
                }

                else
                {
                    x_sq = xval * xval;
                    s1 = std::fma(w_this, xval, s1);
                    s2 = std::fma(w_this, x_sq, s2);
                    s3 = std::fma(w_this, x_sq*xval, s3);
                    s4 = std::fma(w_this, x_sq*x_sq, s4);
                    // s1 += w_this * pw1(xval);
                    // s2 += w_this * pw2(xval);
                    // s3 += w_this * pw3(xval);
                    // s4 += w_this * pw4(xval);
                }

                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }

        if (unlikely(cnt <= 0)) return -HUGE_VAL;
    }

    else
    {
        for (size_t *row = ptr_st;
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                w_this = w[*row];
                xval = Xc[curr_pos];
                
                x_sq = xval * xval;
                s1 = std::fma(w_this, xval, s1);
                s2 = std::fma(w_this, x_sq, s2);
                s3 = std::fma(w_this, x_sq*xval, s3);
                s4 = std::fma(w_this, x_sq*x_sq, s4);
                // s1 += w_this * pw1(xval);
                // s2 += w_this * pw2(xval);
                // s3 += w_this * pw3(xval);
                // s4 += w_this * pw4(xval);

                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }
    }

    if (unlikely(cnt <= 1 || s2 == 0 || s2 == pw2(s1))) return -HUGE_VAL;
    ldouble_safe sn = s1 / cnt;
    ldouble_safe v  = s2 / cnt - pw2(sn);
    if (unlikely(std::isnan(v))) return -HUGE_VAL;
    if (
        v <= std::numeric_limits<double>::epsilon() &&
        !check_more_than_two_unique_values(ix_arr, st, end, col_num,
                                           Xc_indptr, Xc_ind, Xc,
                                           missing_action)
    )
        return -HUGE_VAL;
    if (v <= 0) return 0.;
    ldouble_safe out =  (s4 - 4 * s3 * sn + 6 * s2 * pw2(sn) - 4 * s1 * pw3(sn) + cnt * pw4(sn)) / (cnt * pw2(v));
    return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
}